

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextNextGenBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::EndFrame
          (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this)

{
  Uint64 *pUVar1;
  RenderDeviceVkImpl *this_00;
  SoftwareQueueIndex CmdQueueIndex;
  
  if ((this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_Desc.IsDeferred == true) {
    LOCK();
    (this->m_SubmittedBuffersCmdQueueMask).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
  }
  else {
    this_00 = (this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_pDevice.m_pObject;
    CmdQueueIndex = GetCommandQueueId(this);
    RenderDeviceVkImpl::FlushStaleResources(this_00,CmdQueueIndex);
  }
  pUVar1 = &(this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_FrameNumber;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void EndFrame()
    {
        if (this->IsDeferred())
        {
            // For deferred context, reset submitted cmd queue mask
            m_SubmittedBuffersCmdQueueMask.store(0);
        }
        else
        {
            this->m_pDevice->FlushStaleResources(this->GetCommandQueueId());
        }
        TBase::EndFrame();
    }